

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O0

fdb_txn * wal_earliest_txn(filemgr *file,fdb_txn *cur_txn)

{
  fdb_txn *pfVar1;
  list_elem *plVar2;
  fdb_txn *in_RSI;
  long in_RDI;
  uint64_t min_revnum;
  fdb_txn *ret;
  fdb_txn *txn;
  wal_txn_wrapper *txn_wrapper;
  list_elem *le;
  ulong local_38;
  fdb_txn *local_30;
  list_elem *local_18;
  
  local_30 = (fdb_txn *)0x0;
  local_38 = 0;
  pthread_spin_lock((pthread_spinlock_t *)(*(long *)(in_RDI + 0x48) + 0x60));
  for (local_18 = list_begin((list *)(*(long *)(in_RDI + 0x48) + 0x20));
      local_18 != (list_elem *)0x0; local_18 = list_next(local_18)) {
    pfVar1 = (fdb_txn *)local_18[1].prev;
    if (((pfVar1 != in_RSI) && (plVar2 = list_begin(pfVar1->items), plVar2 != (list_elem *)0x0)) &&
       ((local_38 == 0 || (pfVar1->prev_revnum < local_38)))) {
      local_38 = pfVar1->prev_revnum;
      local_30 = pfVar1;
    }
  }
  pthread_spin_unlock((pthread_spinlock_t *)(*(long *)(in_RDI + 0x48) + 0x60));
  return local_30;
}

Assistant:

fdb_txn * wal_earliest_txn(struct filemgr *file, fdb_txn *cur_txn)
{
    struct list_elem *le;
    struct wal_txn_wrapper *txn_wrapper;
    fdb_txn *txn;
    fdb_txn *ret = NULL;
    uint64_t min_revnum = 0;

    spin_lock(&file->wal->lock);

    le = list_begin(&file->wal->txn_list);
    while(le) {
        txn_wrapper = _get_entry(le, struct wal_txn_wrapper, le);
        txn = txn_wrapper->txn;

        if (txn != cur_txn && list_begin(txn->items)) {
            if (min_revnum == 0 || txn->prev_revnum < min_revnum) {
                min_revnum = txn->prev_revnum;
                ret = txn;
            }
        }
        le = list_next(le);
    }
    spin_unlock(&file->wal->lock);

    return ret;
}